

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O3

void av1_nonrd_pick_intra_mode
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_cost,BLOCK_SIZE bsize,
               PICK_MODE_CONTEXT *ctx)

{
  CANDIDATE_MV *pCVar1;
  byte bVar2;
  _Bool _Var3;
  BLOCK_SIZE BVar4;
  int iVar5;
  int iVar6;
  MB_MODE_INFO *pMVar7;
  MB_MODE_INFO *pMVar8;
  uint8_t *__src;
  CANDIDATE_MV CVar9;
  CANDIDATE_MV CVar10;
  CANDIDATE_MV CVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uint8_t uVar15;
  int64_t iVar16;
  byte bVar17;
  byte bVar18;
  InterpFilter IVar19;
  int iVar20;
  uint uVar21;
  undefined7 in_register_00000009;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  byte bVar26;
  long lVar27;
  estimate_block_intra_args args;
  int local_104;
  long local_f0;
  int local_c4;
  int64_t local_c0;
  undefined4 local_b8;
  undefined1 uStack_b5;
  undefined3 uStack_b4;
  RD_STATS local_a0;
  int64_t local_78;
  AV1_COMP *local_70;
  MACROBLOCK *local_68;
  byte local_60;
  int local_5c;
  RD_STATS *local_58;
  uint local_50;
  undefined2 local_4c;
  ulong local_48;
  int (*local_40) [13];
  MACROBLOCKD *local_38;
  
  pMVar7 = *(x->e_mbd).mi;
  local_60 = 0;
  local_5c = 1;
  local_58 = (RD_STATS *)0x0;
  local_50 = 0xffffffff;
  local_4c = 0;
  local_48 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  bVar17 = ""[(x->txfm_search_params).tx_mode_search_type];
  if (""[local_48] < ""[(x->txfm_search_params).tx_mode_search_type]) {
    bVar17 = ""[local_48];
  }
  pMVar7->tx_size = bVar17;
  if (((cpi->sf).rt_sf.prune_intra_mode_using_best_sad_so_far == true) &&
     (txsize_to_bsize[bVar17] == bsize)) {
    local_4c = 1;
  }
  local_38 = &x->e_mbd;
  pMVar8 = (x->e_mbd).left_mbmi;
  local_70 = cpi;
  local_68 = x;
  bVar17 = av1_above_block_mode((x->e_mbd).above_mbmi);
  bVar18 = av1_left_block_mode(pMVar8);
  uVar23 = x->source_variance;
  local_40 = (x->mode_costs).y_mode_costs[intra_mode_context[bVar17]] + intra_mode_context[bVar18];
  iVar5 = (x->e_mbd).mi_row;
  iVar6 = (x->e_mbd).mi_col;
  local_a0.rate = 0x7fffffff;
  local_a0.zero_rate = 0;
  local_a0.dist = 0x7fffffffffffffff;
  local_a0.rdcost = 0x7fffffffffffffff;
  local_a0.sse = 0x7fffffffffffffff;
  lVar27 = 0;
  local_a0.skip_txfm = '\0';
  pMVar7->field_0xa7 = pMVar7->field_0xa7 & 0xcf;
  pMVar7->mode = '\0';
  pMVar7->uv_mode = '\0';
  pMVar7->ref_frame[0] = '\0';
  pMVar7->ref_frame[1] = -1;
  (pMVar7->palette_mode_info).palette_size[0] = '\0';
  (pMVar7->palette_mode_info).palette_size[1] = '\0';
  (pMVar7->filter_intra_mode_info).use_filter_intra = '\0';
  pMVar7->mv[0] = (int_mv)0x0;
  pMVar7->mv[1] = (int_mv)0x0;
  pMVar7->motion_mode = '\0';
  pMVar7->num_proj_ref = '\x01';
  pMVar7->interintra_mode = '\0';
  IVar19 = (cpi->common).features.interp_filter;
  if (IVar19 == MULTITAP_SHARP2) {
    IVar19 = EIGHTTAP_REGULAR;
  }
  (pMVar7->interp_filters).as_int = (uint)IVar19 << 0x10 | (uint)IVar19;
  pMVar7->mv[0] = (int_mv)0x80008000;
  pMVar7->mv[1] = (int_mv)0x80008000;
  local_104 = 0x7fffffff;
  bVar26 = 0;
  local_c4 = 0;
  local_f0 = 0x7fffffffffffffff;
  local_c0 = 0x7fffffffffffffff;
  local_78 = 0x7fffffffffffffff;
  uVar15 = '\0';
  do {
    bVar2 = ""[lVar27];
    if ((((lVar27 == 0) || (bsize < BLOCK_32X32)) || (x->source_variance != 0)) ||
       ((iVar6 != 0 || (iVar5 != 0)))) {
      if ((lVar27 == 2 & (cpi->sf).rt_sf.prune_h_pred_using_best_mode_so_far & bVar26 == 1) == 0) {
        if (((lVar27 != 0) && ((cpi->sf).rt_sf.enable_intra_mode_pruning_using_neighbors != false))
           && ((bVar2 != bVar17 &&
               ((((x->e_mbd).up_available != false && (bVar2 != bVar18)) &&
                ((x->e_mbd).left_available != false)))))) {
          if ((lVar27 != 3) && (uVar23 < 0x33)) goto LAB_0021e643;
          if (lVar27 == 3 && bVar26 == 0) {
            bVar26 = 0;
            break;
          }
        }
        local_a0._0_8_ = local_a0._0_8_ & 0xffffffff00000000;
        local_a0.dist = 0;
        local_5c = 1;
        local_58 = &local_a0;
        pMVar7->mode = bVar2;
        local_60 = bVar2;
        av1_foreach_transformed_block_in_plane(local_38,bsize,0,av1_estimate_block_intra,&local_70);
        iVar16 = local_a0.dist;
        if (local_a0.rate != 0x7fffffff) {
          pMVar8 = (x->e_mbd).above_mbmi;
          if (pMVar8 == (MB_MODE_INFO *)0x0) {
            uVar22 = 0;
          }
          else {
            uVar22 = (ulong)pMVar8->skip_txfm;
          }
          pMVar8 = (x->e_mbd).left_mbmi;
          if (pMVar8 == (MB_MODE_INFO *)0x0) {
            uVar24 = 0;
          }
          else {
            uVar24 = (ulong)pMVar8->skip_txfm;
          }
          if (local_5c == 0) {
            iVar20 = local_a0.rate + (x->mode_costs).skip_txfm_cost[uVar24 + uVar22][0];
          }
          else {
            iVar20 = (x->mode_costs).skip_txfm_cost[uVar24 + uVar22][1];
          }
          lVar25 = (long)iVar20 + (long)(*local_40)[bVar2];
          iVar20 = (int)lVar25;
          local_a0.rate = iVar20;
          lVar25 = local_a0.dist * 0x80 + (x->rdmult * lVar25 + 0x100 >> 9);
          local_a0.rdcost = lVar25;
          if (lVar25 < local_f0) {
            local_c4 = local_a0.zero_rate;
            local_78 = local_a0.sse;
            local_b8 = local_a0._33_4_;
            uStack_b4 = local_a0._37_3_;
            uVar15 = local_a0.skip_txfm;
            if (local_a0.skip_txfm == '\0') {
              uVar15 = '\0';
              memset(ctx->blk_skip,0,(long)ctx->num_4x4_blk);
            }
            local_c0 = iVar16;
            bVar26 = bVar2;
            local_104 = iVar20;
            local_f0 = lVar25;
          }
        }
      }
      else {
        bVar26 = 1;
      }
    }
LAB_0021e643:
    lVar27 = lVar27 + 1;
  } while (lVar27 != 4);
  iVar5 = (cpi->sf).rt_sf.prune_palette_search_nonrd;
  uVar23 = 0x14;
  if (1 < iVar5) {
    uVar23 = 100;
  }
  uVar21 = local_50 >> (""[local_48] + ""[local_48] & 0x1f);
  if ((cpi->oxcf).tool_cfg.enable_palette == false) {
    if (iVar5 < 1) goto LAB_0021e8c0;
    bVar17 = 0;
LAB_0021e702:
    if ((char)local_4c == '\x01') {
      if ((BLOCK_16X16 < bsize) || (uVar21 <= uVar23)) goto LAB_0021e8c0;
    }
    else if (BLOCK_16X16 < bsize) goto LAB_0021e8c0;
    if ((bVar17 & 200 < x->source_variance) == 0) goto LAB_0021e8c0;
  }
  else {
    _Var3 = (cpi->common).features.allow_screen_content_tools;
    BVar4 = pMVar7->bsize;
    if (0 < iVar5) {
      bVar17 = (BLOCK_8X4 < BVar4 && (BVar4 & ~BLOCK_8X4) != BLOCK_64X128) &
               _Var3 & (BVar4 & ~BLOCK_4X8) != BLOCK_128X64;
      goto LAB_0021e702;
    }
    if ((_Var3 == false) || ((BVar4 < 0x10 && ((0xe007U >> (BVar4 & 0x1f) & 1) != 0))))
    goto LAB_0021e8c0;
  }
  x->color_palette_thresh = (uint)(499 < uVar21) * 0x20 + 0x20;
  av1_search_palette_mode_luma(cpi,x,bsize,0,ctx,&local_a0,local_f0);
  iVar16 = local_a0.rdcost;
  if (local_a0.rdcost < local_f0) {
    pMVar7->mv[0] = (int_mv)0x80008000;
    pMVar7->mv[1] = (int_mv)0x80008000;
    local_104 = local_a0.rate;
    local_c0 = local_a0.dist;
    if (local_a0.skip_txfm == '\0') {
      memcpy(ctx->blk_skip,(x->txfm_search_info).blk_skip,(long)ctx->num_4x4_blk);
    }
    __src = (x->e_mbd).tx_type_map;
    if (*__src != '\0') {
      memcpy(ctx->tx_type_map,__src,(long)ctx->num_4x4_blk);
    }
    bVar26 = 0;
    local_f0 = iVar16;
  }
  else {
    (pMVar7->palette_mode_info).palette_colors[0x10] = 0;
    (pMVar7->palette_mode_info).palette_colors[0x11] = 0;
    (pMVar7->palette_mode_info).palette_colors[0x12] = 0;
    (pMVar7->palette_mode_info).palette_colors[0x13] = 0;
    (pMVar7->palette_mode_info).palette_colors[0x14] = 0;
    (pMVar7->palette_mode_info).palette_colors[0x15] = 0;
    (pMVar7->palette_mode_info).palette_colors[0x16] = 0;
    (pMVar7->palette_mode_info).palette_colors[0x17] = 0;
    (pMVar7->palette_mode_info).palette_colors[8] = 0;
    (pMVar7->palette_mode_info).palette_colors[9] = 0;
    (pMVar7->palette_mode_info).palette_colors[10] = 0;
    (pMVar7->palette_mode_info).palette_colors[0xb] = 0;
    (pMVar7->palette_mode_info).palette_colors[0xc] = 0;
    (pMVar7->palette_mode_info).palette_colors[0xd] = 0;
    (pMVar7->palette_mode_info).palette_colors[0xe] = 0;
    (pMVar7->palette_mode_info).palette_colors[0xf] = 0;
    (pMVar7->palette_mode_info).palette_colors[0] = 0;
    (pMVar7->palette_mode_info).palette_colors[1] = 0;
    (pMVar7->palette_mode_info).palette_colors[2] = 0;
    (pMVar7->palette_mode_info).palette_colors[3] = 0;
    (pMVar7->palette_mode_info).palette_colors[4] = 0;
    (pMVar7->palette_mode_info).palette_colors[5] = 0;
    (pMVar7->palette_mode_info).palette_colors[6] = 0;
    (pMVar7->palette_mode_info).palette_colors[7] = 0;
    (pMVar7->palette_mode_info).palette_size[0] = '\0';
    (pMVar7->palette_mode_info).palette_size[1] = '\0';
  }
LAB_0021e8c0:
  pMVar7->mode = bVar26;
  pMVar7->uv_mode = '\0';
  rd_cost->rate = local_104;
  rd_cost->zero_rate = local_c4;
  rd_cost->dist = local_c0;
  rd_cost->rdcost = local_f0;
  rd_cost->sse = local_78;
  rd_cost->skip_txfm = uVar15;
  *(uint *)&rd_cost->field_0x24 = CONCAT31(uStack_b4,uStack_b5);
  *(undefined4 *)&rd_cost->field_0x21 = local_b8;
  if (((cpi->oxcf).rc_cfg.best_allowed_q == 0) && ((cpi->oxcf).rc_cfg.worst_allowed_q == 0)) {
    (x->txfm_search_info).skip_txfm = '\0';
    memset(ctx->blk_skip,0,(long)ctx->num_4x4_blk);
  }
  bVar17 = (x->txfm_search_info).skip_txfm;
  (ctx->rd_stats).skip_txfm = bVar17;
  ctx->skippable = (uint)bVar17;
  memcpy(ctx,*(x->e_mbd).mi,0xb0);
  ctx->skippable = (uint)(x->txfm_search_info).skip_txfm;
  pMVar7 = *(x->e_mbd).mi;
  bVar17 = pMVar7->ref_frame[0];
  bVar18 = pMVar7->ref_frame[1];
  if ('\0' < (char)bVar18) {
    if (bVar18 < 5 || '\x04' < (char)bVar17) {
      lVar27 = 0;
      do {
        if ((bVar17 == (&comp_ref0_lut)[lVar27]) && (bVar18 == (&comp_ref1_lut)[lVar27])) {
          bVar17 = (char)lVar27 + 0x14;
          goto LAB_0021e9cc;
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 != 9);
    }
    bVar17 = (bVar18 * '\x04' + bVar17) - 0xd;
  }
LAB_0021e9cc:
  pCVar1 = (x->mbmi_ext).ref_mv_stack[bVar17];
  CVar9 = *pCVar1;
  CVar10 = pCVar1[1];
  pCVar1 = (x->mbmi_ext).ref_mv_stack[bVar17] + 2;
  CVar11 = pCVar1[1];
  (ctx->mbmi_ext_best).ref_mv_stack[2] = *pCVar1;
  (ctx->mbmi_ext_best).ref_mv_stack[3] = CVar11;
  (ctx->mbmi_ext_best).ref_mv_stack[0] = CVar9;
  (ctx->mbmi_ext_best).ref_mv_stack[1] = CVar10;
  *&(ctx->mbmi_ext_best).weight = (x->mbmi_ext).weight[bVar17];
  (ctx->mbmi_ext_best).mode_context = (x->mbmi_ext).mode_context[bVar17];
  (ctx->mbmi_ext_best).ref_mv_count = (x->mbmi_ext).ref_mv_count[bVar17];
  uVar12 = *(undefined8 *)((x->mbmi_ext).global_mvs + 2);
  uVar13 = *(undefined8 *)((x->mbmi_ext).global_mvs + 4);
  uVar14 = *(undefined8 *)((x->mbmi_ext).global_mvs + 6);
  *(undefined8 *)(ctx->mbmi_ext_best).global_mvs = *(undefined8 *)(x->mbmi_ext).global_mvs;
  *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 2) = uVar12;
  *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 4) = uVar13;
  *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 6) = uVar14;
  return;
}

Assistant:

void av1_nonrd_pick_intra_mode(AV1_COMP *cpi, MACROBLOCK *x, RD_STATS *rd_cost,
                               BLOCK_SIZE bsize, PICK_MODE_CONTEXT *ctx) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mi = xd->mi[0];
  RD_STATS this_rdc, best_rdc;
  struct estimate_block_intra_args args;
  init_estimate_block_intra_args(&args, cpi, x);
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  mi->tx_size =
      AOMMIN(max_txsize_lookup[bsize],
             tx_mode_to_biggest_tx_size[txfm_params->tx_mode_search_type]);
  assert(IMPLIES(xd->lossless[mi->segment_id], mi->tx_size == TX_4X4));
  const BLOCK_SIZE tx_bsize = txsize_to_bsize[mi->tx_size];

  // If the current block size is the same as the transform block size, enable
  // mode pruning based on the best SAD so far.
  if (cpi->sf.rt_sf.prune_intra_mode_using_best_sad_so_far && bsize == tx_bsize)
    args.prune_mode_based_on_sad = true;

  int *bmode_costs;
  PREDICTION_MODE best_mode = DC_PRED;
  const MB_MODE_INFO *above_mi = xd->above_mbmi;
  const MB_MODE_INFO *left_mi = xd->left_mbmi;
  const PREDICTION_MODE A = av1_above_block_mode(above_mi);
  const PREDICTION_MODE L = av1_left_block_mode(left_mi);
  const int above_ctx = intra_mode_context[A];
  const int left_ctx = intra_mode_context[L];
  const unsigned int source_variance = x->source_variance;
  bmode_costs = x->mode_costs.y_mode_costs[above_ctx][left_ctx];
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  av1_invalid_rd_stats(&best_rdc);
  av1_invalid_rd_stats(&this_rdc);

  init_mbmi_nonrd(mi, DC_PRED, INTRA_FRAME, NONE_FRAME, cm);
  mi->mv[0].as_int = mi->mv[1].as_int = INVALID_MV;

  // Change the limit of this loop to add other intra prediction
  // mode tests.
  for (int mode_index = 0; mode_index < RTC_INTRA_MODES; ++mode_index) {
    PREDICTION_MODE this_mode = intra_mode_list[mode_index];

    // Force DC for spatially flat block for large bsize, on top-left corner.
    // This removed potential artifact observed in gray scale image for high Q.
    if (x->source_variance == 0 && mi_col == 0 && mi_row == 0 &&
        bsize >= BLOCK_32X32 && this_mode > 0)
      continue;

    // As per the statistics generated for intra mode evaluation in the nonrd
    // path, it is found that the probability of H_PRED mode being the winner is
    // very low when the best mode so far is V_PRED (out of DC_PRED and V_PRED).
    // If V_PRED is the winner mode out of DC_PRED and V_PRED, it could imply
    // the presence of a vertically dominant pattern. Hence, H_PRED mode is not
    // evaluated.
    if (cpi->sf.rt_sf.prune_h_pred_using_best_mode_so_far &&
        this_mode == H_PRED && best_mode == V_PRED)
      continue;

    if (should_prune_intra_modes_using_neighbors(
            xd, cpi->sf.rt_sf.enable_intra_mode_pruning_using_neighbors,
            this_mode, A, L)) {
      // Prune V_PRED and H_PRED if source variance of the block is less than
      // or equal to 50. The source variance threshold is obtained empirically.
      if ((this_mode == V_PRED || this_mode == H_PRED) && source_variance <= 50)
        continue;

      // As per the statistics, probability of SMOOTH_PRED being the winner is
      // low when best mode so far is DC_PRED (out of DC_PRED, V_PRED and
      // H_PRED). Hence, SMOOTH_PRED mode is not evaluated.
      if (best_mode == DC_PRED && this_mode == SMOOTH_PRED) continue;
    }

    this_rdc.dist = this_rdc.rate = 0;
    args.mode = this_mode;
    args.skippable = 1;
    args.rdc = &this_rdc;
    mi->mode = this_mode;
    av1_foreach_transformed_block_in_plane(xd, bsize, AOM_PLANE_Y,
                                           av1_estimate_block_intra, &args);

    if (this_rdc.rate == INT_MAX) continue;

    const int skip_ctx = av1_get_skip_txfm_context(xd);
    if (args.skippable) {
      this_rdc.rate = x->mode_costs.skip_txfm_cost[skip_ctx][1];
    } else {
      this_rdc.rate += x->mode_costs.skip_txfm_cost[skip_ctx][0];
    }
    this_rdc.rate += bmode_costs[this_mode];
    this_rdc.rdcost = RDCOST(x->rdmult, this_rdc.rate, this_rdc.dist);

    if (this_rdc.rdcost < best_rdc.rdcost) {
      best_rdc = this_rdc;
      best_mode = this_mode;
      if (!this_rdc.skip_txfm) {
        memset(ctx->blk_skip, 0,
               sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
      }
    }
  }

  const unsigned int thresh_sad =
      cpi->sf.rt_sf.prune_palette_search_nonrd > 1 ? 100 : 20;
  const unsigned int best_sad_norm =
      args.best_sad >>
      (b_width_log2_lookup[bsize] + b_height_log2_lookup[bsize]);

  // Try palette if it's enabled.
  bool try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                        mi->bsize);
  if (cpi->sf.rt_sf.prune_palette_search_nonrd > 0) {
    bool prune =
        (!args.prune_mode_based_on_sad || best_sad_norm > thresh_sad) &&
        bsize <= BLOCK_16X16 && x->source_variance > 200;
    try_palette &= prune;
  }
  if (try_palette) {
    const TxfmSearchInfo *txfm_info = &x->txfm_search_info;
    const unsigned int intra_ref_frame_cost = 0;
    x->color_palette_thresh = (best_sad_norm < 500) ? 32 : 64;

    // Search palette mode for Luma plane in intra frame.
    av1_search_palette_mode_luma(cpi, x, bsize, intra_ref_frame_cost, ctx,
                                 &this_rdc, best_rdc.rdcost);
    // Update best mode data.
    if (this_rdc.rdcost < best_rdc.rdcost) {
      best_mode = DC_PRED;
      mi->mv[0].as_int = INVALID_MV;
      mi->mv[1].as_int = INVALID_MV;
      best_rdc.rate = this_rdc.rate;
      best_rdc.dist = this_rdc.dist;
      best_rdc.rdcost = this_rdc.rdcost;
      if (!this_rdc.skip_txfm) {
        memcpy(ctx->blk_skip, txfm_info->blk_skip,
               sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
      }
      if (xd->tx_type_map[0] != DCT_DCT)
        av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
    } else {
      av1_zero(mi->palette_mode_info);
    }
  }

  mi->mode = best_mode;
  // Keep DC for UV since mode test is based on Y channel only.
  mi->uv_mode = UV_DC_PRED;
  *rd_cost = best_rdc;

  // For lossless: always force the skip flags off.
  // Even though the blk_skip is set to 0 above in the rdcost comparison,
  // do it here again in case the above logic changes.
  if (is_lossless_requested(&cpi->oxcf.rc_cfg)) {
    x->txfm_search_info.skip_txfm = 0;
    memset(ctx->blk_skip, 0,
           sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
  }

#if CONFIG_INTERNAL_STATS
  store_coding_context_nonrd(x, ctx, mi->mode);
#else
  store_coding_context_nonrd(x, ctx);
#endif  // CONFIG_INTERNAL_STATS
}